

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

ON_ScaleValue *
ON_ScaleValue::CreateFromSubString
          (ON_ScaleValue *__return_storage_ptr__,ON_ParseSettings parse_settings,wchar_t *string,
          int string_count,wchar_t **string_end)

{
  wchar_t wVar1;
  double __x;
  double dVar2;
  ON_ParseSettings OVar3;
  wchar_t *pwVar4;
  bool bVar5;
  LengthUnitSystem LVar6;
  ON_UnitSystem *this;
  ScaleStringFormat local_2a9;
  ON_wString local_260;
  undefined1 local_258 [8];
  ON_ScaleValue scale_value;
  ON_LengthValue local_1b8;
  undefined1 auStack_188 [8];
  ON_ParseSettings right_side_parse_settings;
  ON_LengthValue local_160;
  undefined1 local_130 [8];
  ON_LengthValue right_side;
  wchar_t *right_side_string_end;
  wchar_t *right_side_string;
  size_t separator_count;
  wchar_t *pwStack_e0;
  int i;
  wchar_t *separator_string_end;
  wchar_t *separator_string;
  ScaleStringFormat format_preference;
  LengthUnitSystem left_side_unit_system;
  double left_side_length;
  size_t left_side_count;
  undefined1 local_88 [8];
  ON_LengthValue left_side;
  ON_ParseSettings left_side_parse_settings;
  wchar_t *local_30;
  wchar_t *left_side_string_end;
  wchar_t **string_end_local;
  wchar_t *pwStack_18;
  int string_count_local;
  wchar_t *string_local;
  
  OVar3 = parse_settings;
  if ((string_end != (wchar_t **)0x0) && (&stack0xffffffffffffffe8 != string_end)) {
    *string_end = string;
  }
  left_side_string_end = (wchar_t *)string_end;
  string_end_local._4_4_ = string_count;
  pwStack_18 = string;
  string_local = (wchar_t *)__return_storage_ptr__;
  if (string_count < -1) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x4b4,"","Invalid string_count parameter.");
    ON_ScaleValue(__return_storage_ptr__,&Unset);
    return __return_storage_ptr__;
  }
  if (((string == (wchar_t *)0x0) || (string_count == 0)) || (*string == L'\0')) {
    ON_ScaleValue(__return_storage_ptr__,&Unset);
    return __return_storage_ptr__;
  }
  local_30 = (wchar_t *)0x0;
  left_side.m_length_as_string.m_s._0_4_ = parse_settings.m_true_default_bits[0];
  left_side.m_length_as_string.m_s._4_4_ = parse_settings.m_true_default_bits[1];
  parse_settings = OVar3;
  ON_LengthValue::CreateFromSubString
            ((ON_LengthValue *)local_88,OVar3,string,string_count,&local_30);
  bVar5 = ON_LengthValue::IsUnset((ON_LengthValue *)local_88);
  if (((bVar5) || (local_30 == (wchar_t *)0x0)) || (local_30 <= pwStack_18)) {
    ON_ScaleValue(__return_storage_ptr__,&Unset);
    goto LAB_00860ba0;
  }
  if ((string_end_local._4_4_ != -1) &&
     (string_end_local._4_4_ =
           string_end_local._4_4_ - (int)((long)local_30 - (long)pwStack_18 >> 2),
     string_end_local._4_4_ < 0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x4cd,"","Invalid input parameters.");
    ON_ScaleValue(__return_storage_ptr__,&Unset);
    goto LAB_00860ba0;
  }
  __x = ON_LengthValue::Length((ON_LengthValue *)local_88,None);
  this = ON_LengthValue::LengthUnitSystem((ON_LengthValue *)local_88);
  LVar6 = ON_UnitSystem::UnitSystem(this);
  pwVar4 = local_30;
  separator_string._6_1_ = Unset;
  pwStack_e0 = local_30;
  for (separator_count._4_4_ = 0;
      string_end_local._4_4_ == -1 || separator_count._4_4_ < string_end_local._4_4_;
      separator_count._4_4_ = separator_count._4_4_ + 1) {
    bVar5 = ON_ParseSettings::IsInteriorWhiteSpace(&parse_settings,pwVar4[separator_count._4_4_]);
    if (!bVar5) {
      wVar1 = pwVar4[separator_count._4_4_];
      if (wVar1 == L'/') {
        separator_string._6_1_ = FractionFormat;
      }
      else if (wVar1 == L':') {
        separator_string._6_1_ = RatioFormat;
      }
      else if (wVar1 == L'=') {
        separator_string._6_1_ = EquationFormat;
      }
      if (separator_string._6_1_ != Unset) goto LAB_00860652;
      goto LAB_008606cf;
    }
  }
  goto LAB_00860701;
  while (bVar5 = ON_ParseSettings::IsInteriorWhiteSpace
                           (&parse_settings,pwVar4[separator_count._4_4_]), bVar5) {
LAB_00860652:
    separator_count._4_4_ = separator_count._4_4_ + 1;
    if (string_end_local._4_4_ != -1 && string_end_local._4_4_ <= separator_count._4_4_) break;
  }
LAB_008606cf:
  pwStack_e0 = pwVar4 + separator_count._4_4_;
LAB_00860701:
  if ((string_end_local._4_4_ != -1) &&
     (string_end_local._4_4_ = string_end_local._4_4_ - (int)((long)pwStack_e0 - (long)pwVar4 >> 2),
     string_end_local._4_4_ < 1)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x4ff,"","Invalid input parameters.");
    ON_ScaleValue(__return_storage_ptr__,&Unset);
    goto LAB_00860ba0;
  }
  right_side.m_length_as_string.m_s = pwStack_e0;
  ON_LengthValue::ON_LengthValue((ON_LengthValue *)local_130);
  OVar3 = parse_settings;
  if (separator_string._6_1_ == Unset) {
    if (LVar6 == None) {
      ON_LengthValue::Create(&local_160,1.0,None,0,ExactDecimal);
      ON_LengthValue::operator=((ON_LengthValue *)local_130,&local_160);
      ON_LengthValue::~ON_LengthValue(&local_160);
      dVar2 = floor(__x);
      bVar5 = false;
      if ((__x == dVar2) && (!NAN(__x) && !NAN(dVar2))) {
        bVar5 = true;
      }
      local_2a9 = RatioFormat;
      if (!bVar5) {
        local_2a9 = EquationFormat;
      }
      separator_string._6_1_ = local_2a9;
      goto LAB_008609aa;
    }
    ON_ScaleValue(__return_storage_ptr__,&Unset);
  }
  else {
    auStack_188._0_4_ = parse_settings.m_true_default_bits[0];
    auStack_188._4_4_ = parse_settings.m_true_default_bits[1];
    parse_settings.m_false_default_bits = OVar3.m_false_default_bits;
    right_side_parse_settings.m_true_default_bits[0] = parse_settings.m_false_default_bits[0];
    right_side_parse_settings.m_true_default_bits[1] = parse_settings.m_false_default_bits[1];
    parse_settings._16_8_ = OVar3._16_8_;
    right_side_parse_settings.m_false_default_bits = (ON__UINT32  [2])parse_settings._16_8_;
    parse_settings.m_reserved = OVar3.m_reserved;
    right_side_parse_settings._16_8_ = parse_settings.m_reserved;
    parse_settings = OVar3;
    ON_ParseSettings::SetParseLeadingWhiteSpace((ON_ParseSettings *)auStack_188,false);
    scale_value.m_right_length.m_length_as_string.m_s = (wchar_t *)auStack_188;
    OVar3.m_false_default_bits[0] = right_side_parse_settings.m_true_default_bits[0];
    OVar3.m_false_default_bits[1] = right_side_parse_settings.m_true_default_bits[1];
    OVar3.m_true_default_bits[0] = auStack_188._0_4_;
    OVar3.m_true_default_bits[1] = auStack_188._4_4_;
    OVar3._16_8_ = right_side_parse_settings.m_false_default_bits;
    OVar3.m_reserved._0_4_ = right_side_parse_settings.m_reserved_bits;
    OVar3.m_reserved._4_2_ = right_side_parse_settings.m_context_locale_id;
    OVar3.m_reserved._6_1_ = right_side_parse_settings.m_context_angle_unit_system;
    OVar3.m_reserved._7_1_ = right_side_parse_settings.m_context_length_unit_system;
    ON_LengthValue::CreateFromSubString
              (&local_1b8,OVar3,pwStack_e0,string_end_local._4_4_,&right_side.m_length_as_string.m_s
              );
    ON_LengthValue::operator=((ON_LengthValue *)local_130,&local_1b8);
    ON_LengthValue::~ON_LengthValue(&local_1b8);
LAB_008609aa:
    bVar5 = ON_LengthValue::IsUnset((ON_LengthValue *)local_130);
    if (bVar5) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
                 ,0x51e,"","Invalid input parameters.");
      ON_ScaleValue(__return_storage_ptr__,&Unset);
    }
    else {
      Create((ON_ScaleValue *)local_258,(ON_LengthValue *)local_88,(ON_LengthValue *)local_130,
             separator_string._6_1_);
      bVar5 = IsUnset((ON_ScaleValue *)local_258);
      if ((bVar5) || (right_side.m_length_as_string.m_s <= pwStack_18)) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
                   ,0x52a,"","Invalid input parameters.");
        ON_ScaleValue(__return_storage_ptr__,&Unset);
      }
      else {
        ON_wString::ON_wString
                  (&local_260,pwStack_18,
                   (int)((ulong)((long)right_side.m_length_as_string.m_s - (long)pwStack_18) >> 2));
        ON_wString::operator=((ON_wString *)&scale_value.m_context_locale_id,&local_260);
        ON_wString::~ON_wString(&local_260);
        ON_wString::TrimLeftAndRight((ON_wString *)&scale_value.m_context_locale_id,(wchar_t *)0x0);
        if (left_side_string_end != (wchar_t *)0x0) {
          *(wchar_t **)left_side_string_end = right_side.m_length_as_string.m_s;
        }
        ON_ScaleValue(__return_storage_ptr__,(ON_ScaleValue *)local_258);
      }
      ~ON_ScaleValue((ON_ScaleValue *)local_258);
    }
  }
  ON_LengthValue::~ON_LengthValue((ON_LengthValue *)local_130);
LAB_00860ba0:
  ON_LengthValue::~ON_LengthValue((ON_LengthValue *)local_88);
  return __return_storage_ptr__;
}

Assistant:

ON_ScaleValue ON_ScaleValue::CreateFromSubString(
  ON_ParseSettings parse_settings,
  const wchar_t* string,
  int string_count,
  const wchar_t** string_end
)
{
  // All calls to some version of ON_AngleValue::CreateFrom*String(...) end up here.
  if (nullptr != string_end && &string != string_end)
    *string_end = string;

  if (string_count < -1)
  {
    ON_ERROR("Invalid string_count parameter.");
    return ON_ScaleValue::Unset;
  }

  if (nullptr == string || 0 == string_count || 0 == string[0] )
  {
    // empty string fails silently.
    return ON_ScaleValue::Unset;
  }

  const wchar_t* left_side_string_end = nullptr;
  ON_ParseSettings left_side_parse_settings = parse_settings;

  const ON_LengthValue left_side = ON_LengthValue::CreateFromSubString( left_side_parse_settings, string, string_count, &left_side_string_end);

  if (left_side.IsUnset() || nullptr == left_side_string_end || !(string < left_side_string_end))
    return ON_ScaleValue::Unset;

  const size_t left_side_count = left_side_string_end - string;
  if ( -1 != string_count )
  {
    string_count -= (int)left_side_count;
    // 0 = string_count may be ok - conditions checked later.
    if (string_count < 0)
    {
      ON_ERROR("Invalid input parameters.");
      return ON_ScaleValue::Unset;
    }
  }

  const double left_side_length = left_side.Length(ON::LengthUnitSystem::None);
  const ON::LengthUnitSystem left_side_unit_system = left_side.LengthUnitSystem().UnitSystem();

  // look for equal, colon or fraction;
  ON_ScaleValue::ScaleStringFormat format_preference = ON_ScaleValue::ScaleStringFormat::Unset;
  const wchar_t* separator_string = left_side_string_end;
  const wchar_t* separator_string_end = separator_string;
  for (int i = 0; -1 == string_count || i < string_count; i++)
  {
    if (parse_settings.IsInteriorWhiteSpace(separator_string[i]))
      continue;

    switch (separator_string[i])
    {
    case ':':
      format_preference = ON_ScaleValue::ScaleStringFormat::RatioFormat;
      break;

    case '=':
      format_preference = ON_ScaleValue::ScaleStringFormat::EquationFormat;
      break;

    case '/':
      format_preference = ON_ScaleValue::ScaleStringFormat::FractionFormat;
      break;
    }

    if (ON_ScaleValue::ScaleStringFormat::Unset != format_preference)
    {
      for (i++; -1 == string_count || i < string_count; i++)
      {
        if (false == parse_settings.IsInteriorWhiteSpace(separator_string[i]))
          break;
      }
    }
    separator_string_end = separator_string + i;
    break;
  }

  const size_t separator_count = separator_string_end - separator_string;
  if ( -1 != string_count )
  {
    string_count -= (int)separator_count;
    if (string_count <= 0)
    {
      ON_ERROR("Invalid input parameters.");
      return ON_ScaleValue::Unset;
    }
  }

  const wchar_t* right_side_string = separator_string_end;
  const wchar_t* right_side_string_end = right_side_string;
  ON_LengthValue right_side;

  if (ON_ScaleValue::ScaleStringFormat::Unset == format_preference)
  {
    // A single value scanned.
    if (ON::LengthUnitSystem::None != left_side_unit_system)
      return ON_ScaleValue::Unset;
    right_side = ON_LengthValue::Create(1.0, ON::LengthUnitSystem::None, 0, ON_LengthValue::StringFormat::ExactDecimal);

    format_preference
      = (left_side_length == floor(left_side_length) && ON::LengthUnitSystem::None == left_side_unit_system)
        ? ON_ScaleValue::ScaleStringFormat::RatioFormat
        : ON_ScaleValue::ScaleStringFormat::EquationFormat;
  }
  else
  {
    // parse right side
    ON_ParseSettings right_side_parse_settings = parse_settings;
    right_side_parse_settings.SetParseLeadingWhiteSpace(false);
    right_side = ON_LengthValue::CreateFromSubString( right_side_parse_settings, right_side_string, string_count, &right_side_string_end );
  }

  if (right_side.IsUnset())
  {
    ON_ERROR("Invalid input parameters.");
    return ON_ScaleValue::Unset;
  }

  ON_ScaleValue scale_value = ON_ScaleValue::Create(
    left_side,
    right_side,
    format_preference
  );

  if (scale_value.IsUnset() || !(right_side_string_end > string))
  {
    ON_ERROR("Invalid input parameters.");
    return ON_ScaleValue::Unset;
  }

  scale_value.m_scale_as_string = ON_wString(string, (int)(right_side_string_end - string));
  scale_value.m_scale_as_string.TrimLeftAndRight();

  if (nullptr != string_end)
    *string_end = right_side_string_end;

  return scale_value;
}